

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::ensurePolished(QWidget *this)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  QWidget *this_00;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar4 = (*(code *)**(undefined8 **)this)();
  if (lVar4 != *(long *)(lVar1 + 0xc0)) {
    *(long *)(lVar1 + 0xc0) = lVar4;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,Polish);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
    pQVar2 = *(QArrayData **)(lVar1 + 0x18);
    lVar4 = *(long *)(lVar1 + 0x20);
    lVar3 = *(long *)(lVar1 + 0x28);
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar3 != 0) {
      lVar5 = 0;
      do {
        this_00 = *(QWidget **)(lVar4 + lVar5 * 8);
        if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) != 0) {
          ensurePolished(this_00);
        }
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
    if ((*(long *)(lVar1 + 0x10) != 0) && ((*(byte *)(lVar1 + 0x30) & 0x10) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QChildEvent::QChildEvent((QChildEvent *)&local_68,ChildPolished,&this->super_QObject);
      QCoreApplication::sendEvent(*(QObject **)(lVar1 + 0x10),(QEvent *)&local_68);
      QChildEvent::~QChildEvent((QChildEvent *)&local_68);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,8,0x10);
      }
    }
    QEvent::~QEvent((QEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::ensurePolished() const
{
    Q_D(const QWidget);

    const QMetaObject *m = metaObject();
    if (m == d->polished)
        return;
    d->polished = m;

    QEvent e(QEvent::Polish);
    QCoreApplication::sendEvent(const_cast<QWidget *>(this), &e);

    // polish children after 'this'
    QList<QObject*> children = d->children;
    for (int i = 0; i < children.size(); ++i) {
        QObject *o = children.at(i);
        if (!o->isWidgetType())
            continue;
        if (QWidget *w = qobject_cast<QWidget *>(o))
            w->ensurePolished();
    }

    if (d->parent && d->sendChildEvents) {
        QChildEvent e(QEvent::ChildPolished, const_cast<QWidget *>(this));
        QCoreApplication::sendEvent(d->parent, &e);
    }
}